

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

wchar_t archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  archive_string *paVar1;
  size_t sVar2;
  int64_t iVar3;
  unsigned_long uVar4;
  time_t tVar5;
  dev_t dVar6;
  mode_t mVar7;
  wchar_t wVar8;
  int iVar9;
  wchar_t wVar10;
  uint uVar11;
  la_int64_t lVar12;
  archive_entry *entry_00;
  time_t t;
  mtree_entry_conflict *pmVar13;
  char *pcVar14;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar15;
  char *extraout_RDX_02;
  char *fn;
  char *extraout_RDX_03;
  char *pcVar16;
  char *pcVar17;
  mtree_entry_conflict *self;
  mtree_entry_conflict *me;
  undefined8 *puVar18;
  ulong uVar19;
  char name [256];
  mtree_entry_conflict *local_170;
  archive_string local_168;
  undefined8 *local_150;
  archive_string *local_148;
  mtree_entry_conflict *local_140;
  char local_138 [264];
  
  puVar18 = (undefined8 *)a->format_data;
  if (*(int *)(puVar18 + 0xe) != 0) {
    *(undefined4 *)(puVar18 + 0xe) = 0;
    archive_strcat((archive_string *)(puVar18 + 0xb),"#mtree\n");
    if ((*(uint *)(puVar18 + 0x24) & 0x380238) == 0) {
      *(undefined4 *)((long)puVar18 + 300) = 0;
    }
  }
  lVar12 = archive_entry_size(entry);
  puVar18[0xf] = lVar12;
  if ((*(int *)((long)puVar18 + 0x124) != 0) &&
     (mVar7 = archive_entry_filetype(entry), mVar7 != 0x4000)) {
    return L'\0';
  }
  wVar8 = mtree_entry_new(a,entry,&local_170);
  me = local_170;
  if (wVar8 < L'\xffffffec') {
    return wVar8;
  }
  pcVar14 = (char *)a->format_data;
  sVar2 = (local_170->parentdir).length;
  if (sVar2 == 0) {
    if (((local_170->basename).length == 1) && (*(local_170->basename).s == '.')) {
      local_170->parent = local_170;
      pmVar13 = *(mtree_entry_conflict **)(pcVar14 + 8);
      if (pmVar13 != (mtree_entry_conflict *)0x0) goto LAB_00175183;
      *(mtree_entry_conflict **)(pcVar14 + 8) = local_170;
      local_170->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar14 + 0x38) = local_170;
      *(mtree_entry_conflict ***)(pcVar14 + 0x38) = &local_170->next;
      goto LAB_001752e7;
    }
    pcVar14 = (local_170->pathname).s;
    pcVar16 = "Internal programming error in generating canonical name for %s";
LAB_001751a5:
    archive_set_error(&a->archive,-1,pcVar16,pcVar14);
LAB_001751b4:
    wVar8 = L'\xffffffe7';
LAB_001751b9:
    mtree_entry_free(local_170);
  }
  else {
    pcVar16 = (local_170->parentdir).s;
    paVar1 = (archive_string *)(pcVar14 + 0x18);
    pcVar17 = extraout_RDX;
    if ((*(size_t *)(pcVar14 + 0x20) == sVar2) &&
       (iVar9 = strcmp(paVar1->s,pcVar16), pcVar17 = extraout_RDX_00, iVar9 == 0)) {
      iVar9 = __archive_rb_tree_insert_node
                        (*(archive_rb_tree **)(*(long *)(pcVar14 + 0x10) + 0x28),&me->rbnode);
      if (iVar9 == 0) {
        pmVar13 = (mtree_entry_conflict *)
                  __archive_rb_tree_find_node
                            (&(*(mtree_entry_conflict **)(pcVar14 + 0x10))->dir_info->rbtree,
                             (me->basename).s);
LAB_00175183:
        if (((me->mode ^ pmVar13->mode) & 0xf000) != 0) {
          pcVar14 = (pmVar13->pathname).s;
          pcVar16 = "Found duplicate entries `%s\' and its file type is different";
          goto LAB_001751a5;
        }
        (pmVar13->symlink).length = 0;
        archive_string_concat(&pmVar13->symlink,&me->symlink);
        (pmVar13->uname).length = 0;
        archive_string_concat(&pmVar13->uname,&me->uname);
        (pmVar13->gname).length = 0;
        archive_string_concat(&pmVar13->gname,&me->gname);
        (pmVar13->fflags_text).length = 0;
        archive_string_concat(&pmVar13->fflags_text,&me->fflags_text);
        mVar7 = me->filetype;
        pmVar13->nlink = me->nlink;
        pmVar13->filetype = mVar7;
        pmVar13->mode = me->mode;
        iVar3 = me->uid;
        pmVar13->size = me->size;
        pmVar13->uid = iVar3;
        uVar4 = me->fflags_clear;
        pmVar13->fflags_set = me->fflags_set;
        pmVar13->fflags_clear = uVar4;
        tVar5 = me->mtime;
        pmVar13->gid = me->gid;
        pmVar13->mtime = tVar5;
        pmVar13->mtime_nsec = me->mtime_nsec;
        dVar6 = me->rdevminor;
        pmVar13->rdevmajor = me->rdevmajor;
        pmVar13->rdevminor = dVar6;
        dVar6 = me->devminor;
        pmVar13->devmajor = me->devmajor;
        pmVar13->devminor = dVar6;
        pmVar13->ino = me->ino;
        if (pmVar13->dir_info != (dir_info *)0x0) {
          pmVar13->dir_info->virtual = L'\0';
        }
        mtree_entry_free(me);
        me = pmVar13;
      }
      else {
        me->parent = *(mtree_entry_conflict **)(pcVar14 + 0x10);
        me->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(pcVar14 + 0x38) = me;
        *(mtree_entry_conflict ***)(pcVar14 + 0x38) = &me->next;
      }
    }
    else {
      self = *(mtree_entry_conflict **)(pcVar14 + 8);
      wVar10 = get_path_component(local_138,(size_t)pcVar16,pcVar17);
      pcVar17 = pcVar16;
      local_148 = paVar1;
      if (wVar10 != L'\0') {
        pcVar15 = extraout_RDX_01;
        do {
          while( true ) {
            uVar19 = (ulong)(uint)wVar10;
            if (wVar10 < L'\0') goto LAB_00175150;
            if (((wVar10 == L'\x01') && (local_138[0] == '.')) &&
               (self != (mtree_entry_conflict *)0x0)) break;
            if (self == (mtree_entry_conflict *)0x0) {
              self = (mtree_entry_conflict *)0x0;
              goto LAB_00174e58;
            }
LAB_00174da2:
            pmVar13 = (mtree_entry_conflict *)
                      __archive_rb_tree_find_node(&self->dir_info->rbtree,local_138);
            if (pmVar13 == (mtree_entry_conflict *)0x0) goto LAB_00174e58;
            if (*pcVar17 == '\0') goto LAB_00175183;
            if (pmVar13->dir_info == (dir_info *)0x0) {
              archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                                (pmVar13->pathname).s,(me->pathname).s);
              goto LAB_001751b4;
            }
            pcVar17 = pcVar17 + (pcVar17[uVar19] == '/') + uVar19;
            wVar10 = get_path_component(local_138,(size_t)pcVar17,fn);
            pcVar15 = extraout_RDX_03;
            self = pmVar13;
            if (wVar10 == L'\0') {
              uVar19 = 0;
              goto LAB_00174e58;
            }
          }
          if (self != *(mtree_entry_conflict **)(pcVar14 + 8)) goto LAB_00174da2;
          if (pcVar17[1] == '/') {
            pcVar17 = pcVar17 + 2;
          }
          else {
            pcVar17 = pcVar17 + 1;
          }
          wVar10 = get_path_component(local_138,(size_t)pcVar17,pcVar15);
          pcVar15 = extraout_RDX_02;
        } while (wVar10 != L'\0');
      }
      uVar19 = 0;
LAB_00174e58:
      pmVar13 = self;
      local_150 = puVar18;
      if (*pcVar17 != '\0') {
LAB_00174e6c:
        local_168.s = (char *)0x0;
        local_168.length = 0;
        local_168.buffer_length = 0;
        archive_strncat(&local_168,pcVar16,(size_t)(pcVar17 + (uVar19 - (long)pcVar16)));
        pcVar15 = local_168.s;
        if (local_168.s[local_168.length - 1] == '/') {
          local_168.s[local_168.length - 1] = '\0';
          local_168.length = local_168.length - 1;
        }
        entry_00 = archive_entry_new();
        if (entry_00 == (archive_entry *)0x0) {
LAB_0017507b:
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          archive_string_free(&local_168);
        }
        else {
          archive_entry_copy_pathname(entry_00,pcVar15);
          archive_entry_set_mode(entry_00,0x41ed);
          t = time((time_t *)0x0);
          archive_entry_set_mtime(entry_00,t,0);
          wVar10 = mtree_entry_new(a,entry_00,&local_140);
          archive_entry_free(entry_00);
          self = local_140;
          if (wVar10 < L'\xffffffec') goto LAB_0017507b;
          local_140->dir_info->virtual = L'\x01';
          archive_string_free(&local_168);
          pcVar15 = (self->pathname).s;
          if ((*pcVar15 == '.') && (pcVar15[1] == '\0')) {
            *(mtree_entry_conflict **)(pcVar14 + 8) = self;
            pmVar13 = self;
          }
          else {
            __archive_rb_tree_insert_node(&pmVar13->dir_info->rbtree,&self->rbnode);
          }
          self->parent = pmVar13;
          self->next = (mtree_entry_conflict *)0x0;
          **(undefined8 **)(pcVar14 + 0x38) = self;
          *(mtree_entry_conflict ***)(pcVar14 + 0x38) = &self->next;
          pcVar17 = pcVar17 + (pcVar17[uVar19] == '/') + uVar19;
          wVar10 = get_path_component(local_138,(size_t)pcVar17,pcVar14);
          if (L'\xffffffff' < wVar10) goto code_r0x00174fa4;
          archive_string_free(&local_168);
LAB_00175150:
          archive_set_error(&a->archive,-1,"A name buffer is too small");
        }
        wVar8 = L'\xffffffe2';
        goto LAB_001751b9;
      }
LAB_00174fd7:
      paVar1 = local_148;
      *(mtree_entry_conflict **)(pcVar14 + 0x10) = self;
      pcVar14[0x20] = '\0';
      pcVar14[0x21] = '\0';
      pcVar14[0x22] = '\0';
      pcVar14[0x23] = '\0';
      pcVar14[0x24] = '\0';
      pcVar14[0x25] = '\0';
      pcVar14[0x26] = '\0';
      pcVar14[0x27] = '\0';
      archive_string_ensure(local_148,(self->parentdir).length + (self->basename).length + 2);
      puVar18 = local_150;
      sVar2 = (self->parentdir).length;
      if ((self->basename).length + sVar2 == 0) {
        *paVar1->s = '\0';
      }
      else {
        if (sVar2 != 0) {
          pcVar14[0x20] = '\0';
          pcVar14[0x21] = '\0';
          pcVar14[0x22] = '\0';
          pcVar14[0x23] = '\0';
          pcVar14[0x24] = '\0';
          pcVar14[0x25] = '\0';
          pcVar14[0x26] = '\0';
          pcVar14[0x27] = '\0';
          archive_string_concat(paVar1,&self->parentdir);
          archive_strappend_char(paVar1,'/');
        }
        archive_string_concat(paVar1,&self->basename);
      }
      iVar9 = __archive_rb_tree_insert_node(&self->dir_info->rbtree,&me->rbnode);
      if (iVar9 == 0) {
        pmVar13 = (mtree_entry_conflict *)
                  __archive_rb_tree_find_node(&self->dir_info->rbtree,(me->basename).s);
        goto LAB_00175183;
      }
      me->parent = self;
      me->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar14 + 0x38) = me;
      *(mtree_entry_conflict ***)(pcVar14 + 0x38) = &me->next;
      me = local_170;
    }
LAB_001752e7:
    *puVar18 = me;
    if (me->reg_info != (reg_info *)0x0) {
      *(undefined4 *)(puVar18 + 0x1c) = 0;
      uVar11 = *(uint *)(puVar18 + 0x24);
      if ((uVar11 & 1) != 0) {
        puVar18[0x1c] = 1;
        puVar18[0x1d] = 0;
      }
      if ((uVar11 >> 8 & 1) != 0) {
        iVar9 = __archive_md5init((archive_md5_ctx *)(puVar18 + 0x1e));
        if (iVar9 == 0) {
          *(byte *)((long)puVar18 + 0xe1) = *(byte *)((long)puVar18 + 0xe1) | 1;
          uVar11 = *(uint *)(puVar18 + 0x24);
        }
        else {
          uVar11 = *(uint *)(puVar18 + 0x24) & 0xfffffeff;
          *(uint *)(puVar18 + 0x24) = uVar11;
        }
      }
      if ((uVar11 >> 0xd & 1) != 0) {
        iVar9 = __archive_ripemd160init((archive_rmd160_ctx *)(puVar18 + 0x1f));
        if (iVar9 == 0) {
          *(byte *)((long)puVar18 + 0xe1) = *(byte *)((long)puVar18 + 0xe1) | 0x20;
          uVar11 = *(uint *)(puVar18 + 0x24);
        }
        else {
          uVar11 = *(uint *)(puVar18 + 0x24) & 0xffffdfff;
          *(uint *)(puVar18 + 0x24) = uVar11;
        }
      }
      if ((uVar11 >> 0xe & 1) != 0) {
        iVar9 = __archive_sha1init((archive_sha1_ctx *)(puVar18 + 0x20));
        if (iVar9 == 0) {
          *(byte *)((long)puVar18 + 0xe1) = *(byte *)((long)puVar18 + 0xe1) | 0x40;
          uVar11 = *(uint *)(puVar18 + 0x24);
        }
        else {
          uVar11 = *(uint *)(puVar18 + 0x24) & 0xffffbfff;
          *(uint *)(puVar18 + 0x24) = uVar11;
        }
      }
      if ((uVar11 >> 0x17 & 1) != 0) {
        iVar9 = __archive_sha256init((archive_sha256_ctx *)(puVar18 + 0x21));
        if (iVar9 == 0) {
          *(byte *)((long)puVar18 + 0xe2) = *(byte *)((long)puVar18 + 0xe2) | 0x80;
          uVar11 = *(uint *)(puVar18 + 0x24);
        }
        else {
          uVar11 = *(uint *)(puVar18 + 0x24) & 0xff7fffff;
          *(uint *)(puVar18 + 0x24) = uVar11;
        }
      }
      if ((uVar11 >> 0x18 & 1) != 0) {
        iVar9 = __archive_sha384init((archive_sha384_ctx *)(puVar18 + 0x22));
        if (iVar9 == 0) {
          *(byte *)((long)puVar18 + 0xe3) = *(byte *)((long)puVar18 + 0xe3) | 1;
          uVar11 = *(uint *)(puVar18 + 0x24);
        }
        else {
          uVar11 = *(uint *)(puVar18 + 0x24) & 0xfeffffff;
          *(uint *)(puVar18 + 0x24) = uVar11;
        }
      }
      if ((uVar11 >> 0x19 & 1) != 0) {
        iVar9 = __archive_sha512init((archive_sha512_ctx *)(puVar18 + 0x23));
        if (iVar9 == 0) {
          *(byte *)((long)puVar18 + 0xe3) = *(byte *)((long)puVar18 + 0xe3) | 2;
        }
        else {
          *(byte *)((long)puVar18 + 0x123) = *(byte *)((long)puVar18 + 0x123) & 0xfd;
        }
      }
    }
  }
  return wVar8;
code_r0x00174fa4:
  uVar19 = (ulong)(uint)wVar10;
  pmVar13 = self;
  if (*pcVar17 == '\0') goto LAB_00174fd7;
  goto LAB_00174e6c;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of checksum context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}